

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase * AnalyzeYield(ExpressionContext *ctx,SynYield *syntax)

{
  TypeBase *pTVar1;
  SynBase *source;
  bool bVar2;
  uint order;
  FunctionData *pFVar3;
  ExprReturn *this;
  ExprError *this_00;
  TypeBase *type;
  TypeFunction *pTVar4;
  ExprBase *value;
  ExprBase *coroutineStateUpdate;
  ExprBase *closures;
  ExprBase *local_60;
  uint yieldId;
  TypeBase *local_40;
  TypeBase *returnType;
  FunctionData *function_1;
  FunctionData *function;
  ExprBase *result;
  SynYield *syntax_local;
  ExpressionContext *ctx_local;
  
  if (syntax->value == (SynBase *)0x0) {
    local_60 = &ExpressionContext::get<ExprVoid>(ctx)->super_ExprBase;
    ExprVoid::ExprVoid((ExprVoid *)local_60,&syntax->super_SynBase,ctx->typeVoid);
  }
  else {
    local_60 = AnalyzeExpression(ctx,syntax->value);
  }
  bVar2 = isType<TypeError>(local_60->type);
  if (bVar2) {
    pFVar3 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    if (pFVar3 != (FunctionData *)0x0) {
      pFVar3->hasExplicitReturn = true;
    }
    ctx_local = (ExpressionContext *)ExpressionContext::get<ExprYield>(ctx);
    ExprYield::ExprYield
              ((ExprYield *)ctx_local,&syntax->super_SynBase,local_60->type,local_60,(ExprBase *)0x0
               ,(ExprBase *)0x0,0);
  }
  else {
    pFVar3 = ExpressionContext::GetCurrentFunction(ctx,ctx->scope);
    if (pFVar3 == (FunctionData *)0x0) {
      anon_unknown.dwarf_8df1c::Stop
                (ctx,&syntax->super_SynBase,"ERROR: global yield is not allowed");
      ctx_local = (ExpressionContext *)0x0;
    }
    else {
      if ((pFVar3->coroutine & 1U) == 0) {
        anon_unknown.dwarf_8df1c::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: yield can only be used inside a coroutine");
      }
      local_40 = pFVar3->type->returnType;
      if (local_40 == ctx->typeAuto) {
        bVar2 = AssertValueExpression(ctx,&syntax->super_SynBase,local_60);
        if (!bVar2) {
          this = ExpressionContext::get<ExprReturn>(ctx);
          pTVar1 = ctx->typeVoid;
          this_00 = ExpressionContext::get<ExprError>(ctx);
          source = local_60->source;
          type = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          ExprError::ExprError(this_00,source,type,local_60,(ExprBase *)0x0);
          ExprReturn::ExprReturn
                    (this,&syntax->super_SynBase,pTVar1,&this_00->super_ExprBase,(ExprBase *)0x0,
                     (ExprBase *)0x0);
          return &this->super_ExprBase;
        }
        local_40 = local_60->type;
        pTVar4 = ExpressionContext::GetFunctionType
                           (ctx,&syntax->super_SynBase,local_40,pFVar3->type->arguments);
        pFVar3->type = pTVar4;
      }
      if ((local_40 == ctx->typeVoid) && (local_60->type != ctx->typeVoid)) {
        anon_unknown.dwarf_8df1c::Report
                  (ctx,&syntax->super_SynBase,"ERROR: \'void\' function returning a value");
      }
      if ((local_40 != ctx->typeVoid) && (local_60->type == ctx->typeVoid)) {
        anon_unknown.dwarf_8df1c::Report
                  (ctx,&syntax->super_SynBase,"ERROR: function must return a value of type \'%.*s\'"
                   ,(ulong)(uint)((int)(local_40->name).end - (int)(local_40->name).begin));
      }
      value = CreateCast(ctx,&syntax->super_SynBase,local_60,pFVar3->type->returnType,false);
      pFVar3->hasExplicitReturn = true;
      order = pFVar3->yieldCount + 1;
      pFVar3->yieldCount = order;
      ctx_local = (ExpressionContext *)ExpressionContext::get<ExprYield>(ctx);
      pTVar1 = ctx->typeVoid;
      coroutineStateUpdate =
           CreateFunctionCoroutineStateUpdate(ctx,&syntax->super_SynBase,pFVar3,order);
      closures = CreateArgumentUpvalueClose(ctx,&syntax->super_SynBase,pFVar3);
      ExprYield::ExprYield
                ((ExprYield *)ctx_local,&syntax->super_SynBase,pTVar1,value,coroutineStateUpdate,
                 closures,order);
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* AnalyzeYield(ExpressionContext &ctx, SynYield *syntax)
{
	ExprBase *result = syntax->value ? AnalyzeExpression(ctx, syntax->value) : new (ctx.get<ExprVoid>()) ExprVoid(syntax, ctx.typeVoid);

	if(isType<TypeError>(result->type))
	{
		if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
			function->hasExplicitReturn = true;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, result->type, result, NULL, NULL, 0);
	}

	if(FunctionData *function = ctx.GetCurrentFunction(ctx.scope))
	{
		if(!function->coroutine)
			Stop(ctx, syntax, "ERROR: yield can only be used inside a coroutine");

		TypeBase *returnType = function->type->returnType;

		// If return type is auto, set it to type that is being returned
		if(returnType == ctx.typeAuto)
		{
			if(!AssertValueExpression(ctx, syntax, result))
				return new (ctx.get<ExprReturn>()) ExprReturn(syntax, ctx.typeVoid, new (ctx.get<ExprError>()) ExprError(result->source, ctx.GetErrorType(), result, NULL), NULL, NULL);

			returnType = result->type;

			function->type = ctx.GetFunctionType(syntax, returnType, function->type->arguments);
		}

		if(returnType == ctx.typeVoid && result->type != ctx.typeVoid)
			Report(ctx, syntax, "ERROR: 'void' function returning a value");
		if(returnType != ctx.typeVoid && result->type == ctx.typeVoid)
			Report(ctx, syntax, "ERROR: function must return a value of type '%.*s'", FMT_ISTR(returnType->name));

		result = CreateCast(ctx, syntax, result, function->type->returnType, false);

		function->hasExplicitReturn = true;

		// TODO: checked return value

		unsigned yieldId = ++function->yieldCount;

		return new (ctx.get<ExprYield>()) ExprYield(syntax, ctx.typeVoid, result, CreateFunctionCoroutineStateUpdate(ctx, syntax, function, yieldId), CreateArgumentUpvalueClose(ctx, syntax, function), yieldId);
	}

	Stop(ctx, syntax, "ERROR: global yield is not allowed");

	return NULL;
}